

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_begin_newenviron(telnet_t *telnet,uchar cmd)

{
  uchar local_3c;
  char local_3b [3];
  telnet_event_t local_38;
  
  local_38.data.buffer = local_3b;
  local_3b[0] = -1;
  local_3b[1] = -6;
  local_3b[2] = 0x27;
  local_38.type = TELNET_EV_SEND;
  local_38.data.size = 3;
  local_3c = cmd;
  (*telnet->eh)(telnet,&local_38,telnet->ud);
  telnet_send(telnet,(char *)&local_3c,1);
  return;
}

Assistant:

void telnet_begin_newenviron(telnet_t *telnet, unsigned char cmd) {
	telnet_begin_sb(telnet, TELNET_TELOPT_NEW_ENVIRON);
	telnet_send(telnet, (const char *)&cmd, 1);
}